

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O0

void __thiscall MinVR::VRGraphicsWindowNode::~VRGraphicsWindowNode(VRGraphicsWindowNode *this)

{
  VRGraphicsWindowNode *in_RDI;
  
  ~VRGraphicsWindowNode(in_RDI);
  operator_delete(in_RDI,0xf8);
  return;
}

Assistant:

VRGraphicsWindowNode::~VRGraphicsWindowNode() {
}